

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_loop_expand.cpp
# Opt level: O0

bool __thiscall optimization::loop_expand::loop_info::operator<(loop_info *this,loop_info *other)

{
  ostream *poVar1;
  Timestamp *timestamp;
  ostream *poVar2;
  ostream *__a;
  Function *pFVar3;
  long in_RSI;
  long in_RDI;
  size_t in_stack_fffffffffffffc28;
  Function *in_stack_fffffffffffffc30;
  string *in_stack_fffffffffffffc38;
  string *name;
  Function *in_stack_fffffffffffffc40;
  Function *this_00;
  Function *in_stack_fffffffffffffc58;
  ostream *in_stack_fffffffffffffc60;
  char *in_stack_fffffffffffffc68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  Timestamp *in_stack_fffffffffffffcb8;
  undefined1 local_311 [40];
  allocator<char> local_2e9;
  string local_2e8 [16];
  Severity *in_stack_fffffffffffffd28;
  undefined8 in_stack_fffffffffffffd30;
  time_point_sys_clock local_270;
  Timestamp local_268;
  undefined1 local_250 [55];
  undefined1 local_219 [40];
  allocator<char> local_1f1;
  string local_1f0 [120];
  time_point_sys_clock local_178;
  Timestamp local_170 [3];
  undefined1 local_122;
  allocator<char> local_121;
  string local_120 [39];
  allocator<char> local_f9;
  string local_f8 [120];
  time_point_sys_clock local_80;
  Timestamp local_78 [3];
  undefined1 local_19;
  bool local_1;
  
  switch(*(undefined4 *)(in_RDI + 0x20)) {
  case 6:
    local_1 = *(int *)(in_RSI + 0x24) < *(int *)(in_RDI + 0x18);
    break;
  case 7:
    local_1 = *(int *)(in_RDI + 0x18) < *(int *)(in_RSI + 0x24);
    break;
  case 8:
    local_1 = *(int *)(in_RSI + 0x24) <= *(int *)(in_RDI + 0x18);
    break;
  case 9:
    local_1 = *(int *)(in_RDI + 0x18) <= *(int *)(in_RSI + 0x24);
    break;
  case 10:
    local_1 = *(int *)(in_RDI + 0x18) == *(int *)(in_RSI + 0x24);
    break;
  case 0xb:
    local_1 = *(int *)(in_RDI + 0x18) != *(int *)(in_RSI + 0x24);
    break;
  default:
    local_19 = 5;
    poVar1 = AixLog::operator<<((ostream *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    AixLog::Tag::Tag((Tag *)0x1e72fb);
    AixLog::operator<<(in_stack_fffffffffffffc60,(Tag *)in_stack_fffffffffffffc58);
    local_80.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_78,&local_80);
    timestamp = (Timestamp *)AixLog::operator<<(poVar1,in_stack_fffffffffffffcb8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
               (allocator<char> *)in_stack_fffffffffffffc60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
               (allocator<char> *)in_stack_fffffffffffffc60);
    AixLog::Function::Function
              (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
               (string *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    poVar2 = AixLog::operator<<(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    std::operator<<(poVar2,"ERROR ! Unrecognized in_op");
    AixLog::Function::~Function(in_stack_fffffffffffffc30);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator(&local_121);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator(&local_f9);
    AixLog::Timestamp::~Timestamp(local_78);
    AixLog::Tag::~Tag((Tag *)0x1e7471);
    local_122 = 5;
    AixLog::operator<<((ostream *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    AixLog::Tag::Tag((Tag *)0x1e74a4);
    AixLog::operator<<(in_stack_fffffffffffffc60,(Tag *)in_stack_fffffffffffffc58);
    local_178.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_170,&local_178);
    AixLog::operator<<(poVar1,timestamp);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
               (allocator<char> *)in_stack_fffffffffffffc60);
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_219;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,in_stack_fffffffffffffc68,(allocator<char> *)in_stack_fffffffffffffc60);
    AixLog::Function::Function
              (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
               (string *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    poVar2 = AixLog::operator<<(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    mir::inst::display_op
              ((ostream *)in_stack_fffffffffffffc30,(Op)(in_stack_fffffffffffffc28 >> 0x20));
    AixLog::Function::~Function(in_stack_fffffffffffffc30);
    std::__cxx11::string::~string((string *)(local_219 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_219);
    std::__cxx11::string::~string(local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    AixLog::Timestamp::~Timestamp(local_170);
    AixLog::Tag::~Tag((Tag *)0x1e7600);
    local_250[0x36] = 5;
    AixLog::operator<<((ostream *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    pFVar3 = (Function *)local_250;
    AixLog::Tag::Tag((Tag *)0x1e7633);
    __a = AixLog::operator<<(in_stack_fffffffffffffc60,(Tag *)pFVar3);
    local_270.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(&local_268,&local_270);
    AixLog::operator<<(poVar1,timestamp);
    this_00 = (Function *)&local_2e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)poVar2,(allocator<char> *)__a);
    name = (string *)local_311;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)poVar2,(allocator<char> *)__a);
    AixLog::Function::Function
              (this_00,name,(string *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    pFVar3 = (Function *)AixLog::operator<<(__a,pFVar3);
    poVar1 = std::operator<<((ostream *)pFVar3," ! ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    AixLog::Function::~Function(pFVar3);
    std::__cxx11::string::~string((string *)(local_311 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_311);
    std::__cxx11::string::~string(local_2e8);
    std::allocator<char>::~allocator(&local_2e9);
    AixLog::Timestamp::~Timestamp(&local_268);
    AixLog::Tag::~Tag((Tag *)0x1e77a1);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool operator<(const loop_info& other) const {
    switch (in_op) {
      case mir::inst::Op::Eq:
        return init_var.second == other.in_value;
      case mir::inst::Op::Neq:
        return init_var.second != other.in_value;
      case mir::inst::Op::Lt:
        return init_var.second < other.in_value;
      case mir::inst::Op::Lte:
        return init_var.second <= other.in_value;
      case mir::inst::Op::Gt:
        return init_var.second > other.in_value;
      case mir::inst::Op::Gte:
        return init_var.second >= other.in_value;
      default: {
        LOG(ERROR) << "ERROR ! Unrecognized in_op";
        mir::inst::display_op(LOG(ERROR), in_op);
        LOG(ERROR) << " ! " << std::endl;
        return false;
      }
    }
  }